

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

void Q_SetKer(QMatrix *Q,Vector *RightKer,Vector *LeftKer)

{
  Real *pRVar1;
  Real *pRVar2;
  double dVar3;
  LASErrIdType LVar4;
  Real *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Real *KerCmp;
  size_t Ind;
  size_t Dim;
  double Norm;
  double Cmp;
  double Mean;
  double Sum;
  Vector *LeftKer_local;
  Vector *RightKer_local;
  QMatrix *Q_local;
  undefined4 uVar8;
  
  V_Lock(RightKer);
  V_Lock(LeftKer);
  LVar4 = LASResult();
  if (LVar4 == LASOK) {
    if ((Q->Dim == RightKer->Dim) && ((Q->Symmetry != False || (Q->Dim == LeftKer->Dim)))) {
      pRVar1 = (Real *)Q->Dim;
      if (Q->RightKerCmp != (Real *)0x0) {
        free(Q->RightKerCmp);
        Q->RightKerCmp = (Real *)0x0;
      }
      if (Q->LeftKerCmp != (Real *)0x0) {
        free(Q->LeftKerCmp);
        Q->LeftKerCmp = (Real *)0x0;
      }
      Q->UnitRightKer = False;
      Q->UnitLeftKer = False;
      pRVar2 = RightKer->Cmp;
      Mean = 0.0;
      for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
        Mean = pRVar2[(long)KerCmp] + Mean;
      }
      uVar8 = (undefined4)((ulong)pRVar1 >> 0x20);
      auVar6._8_4_ = uVar8;
      auVar6._0_8_ = pRVar1;
      auVar6._12_4_ = 0x45300000;
      dVar3 = Mean / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)pRVar1) - 4503599627370496.0));
      Q->UnitRightKer = True;
      if (ABS(dVar3) < 2.2250738585072014e-307) {
        Q->UnitRightKer = False;
      }
      else {
        for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
          if (2.220446049250313e-15 <= ABS(pRVar2[(long)KerCmp] / dVar3 - 1.0)) {
            Q->UnitRightKer = False;
          }
        }
      }
      if (Q->UnitRightKer == False) {
        Mean = 0.0;
        for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
          Mean = pRVar2[(long)KerCmp] * pRVar2[(long)KerCmp] + Mean;
        }
        dVar3 = sqrt(Mean);
        if (2.2250738585072014e-307 <= ABS(dVar3)) {
          pRVar5 = (Real *)malloc(((long)pRVar1 + 1U) * 8);
          Q->RightKerCmp = pRVar5;
          if (Q->RightKerCmp == (Real *)0x0) {
            LASError(LASMemAllocErr,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
          }
          else {
            for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
              Q->RightKerCmp[(long)KerCmp] = pRVar2[(long)KerCmp] / dVar3;
            }
          }
        }
      }
      if (Q->Symmetry == False) {
        pRVar2 = LeftKer->Cmp;
        Mean = 0.0;
        for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
          Mean = pRVar2[(long)KerCmp] + Mean;
        }
        auVar7._8_4_ = uVar8;
        auVar7._0_8_ = pRVar1;
        auVar7._12_4_ = 0x45300000;
        dVar3 = Mean / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)pRVar1) - 4503599627370496.0));
        Q->UnitLeftKer = True;
        if (ABS(dVar3) < 2.2250738585072014e-307) {
          Q->UnitLeftKer = False;
        }
        else {
          for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
            if (2.220446049250313e-15 <= ABS(pRVar2[(long)KerCmp] / dVar3 - 1.0)) {
              Q->UnitLeftKer = False;
            }
          }
        }
        if (Q->UnitLeftKer == False) {
          Mean = 0.0;
          for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
            Mean = pRVar2[(long)KerCmp] * pRVar2[(long)KerCmp] + Mean;
          }
          dVar3 = sqrt(Mean);
          if (2.2250738585072014e-307 <= ABS(dVar3)) {
            pRVar5 = (Real *)malloc(((long)pRVar1 + 1U) * 8);
            Q->LeftKerCmp = pRVar5;
            if (Q->LeftKerCmp == (Real *)0x0) {
              LASError(LASMemAllocErr,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
            }
            else {
              for (KerCmp = (Real *)0x1; KerCmp <= pRVar1; KerCmp = (Real *)((long)KerCmp + 1)) {
                Q->LeftKerCmp[(long)KerCmp] = pRVar2[(long)KerCmp] / dVar3;
              }
            }
          }
        }
      }
    }
    else {
      LASError(LASDimErr,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
    }
  }
  V_Unlock(RightKer);
  V_Unlock(LeftKer);
  return;
}

Assistant:

void Q_SetKer(QMatrix *Q, Vector *RightKer, Vector *LeftKer)
/* defines the null space in the case of a singular matrix */
{
    double Sum, Mean, Cmp, Norm;
    size_t Dim, Ind;
    Real *KerCmp;

    V_Lock(RightKer);
    V_Lock(LeftKer);
    
    if (LASResult() == LASOK) {
	if (Q->Dim == RightKer->Dim && (Q->Symmetry || Q->Dim == LeftKer->Dim)) {
  	    Dim = Q->Dim;
	    
	    /* release array for old null space components when it exists */ 
	    if (Q->RightKerCmp != NULL) {
	        free(Q->RightKerCmp);
	        Q->RightKerCmp = NULL;
	    }
	    if (Q->LeftKerCmp != NULL) {
	        free(Q->LeftKerCmp);
	        Q->LeftKerCmp = NULL;
	    }
	    Q->UnitRightKer = False;
	    Q->UnitLeftKer = False;
	    
	    /* right null space */
            KerCmp = RightKer->Cmp;
	    /* test whether the matrix Q has a unit right null space */
	    Sum = 0.0;
	    for(Ind = 1; Ind <= Dim; Ind++)
	        Sum += KerCmp[Ind];
	    Mean = Sum / (double)Dim;
	    Q->UnitRightKer = True;
	    if (!IsZero(Mean)) {
	        for(Ind = 1; Ind <= Dim; Ind++)
                    if (!IsOne(KerCmp[Ind] / Mean))
		        Q->UnitRightKer = False;
            } else {
	        Q->UnitRightKer = False;
	    }
	    if (!Q->UnitRightKer) {
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++) {
	            Cmp = KerCmp[Ind];
	            Sum += Cmp * Cmp;
	        }
		Norm = sqrt(Sum);
		if (!IsZero(Norm)) {
                    Q->RightKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		    if (Q->RightKerCmp != NULL) {
		        for(Ind = 1; Ind <= Dim; Ind++)
	                    Q->RightKerCmp[Ind] = KerCmp[Ind] / Norm;
		    } else {
	                LASError(LASMemAllocErr, "Q_SetKer", Q->Name, RightKer->Name,
		            LeftKer->Name);
		    }
		}
	    }
	    
	    if (!Q->Symmetry) {
	        /* left null space */
                KerCmp = LeftKer->Cmp;
	        /* test whether the matrix Q has a unit left null space */
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++)
	            Sum += KerCmp[Ind];
	        Mean = Sum / (double)Dim;
	        Q->UnitLeftKer = True;
	        if (!IsZero(Mean)) {
	            for(Ind = 1; Ind <= Dim; Ind++)
                        if (!IsOne(KerCmp[Ind] / Mean))
		            Q->UnitLeftKer = False;
                } else {
	            Q->UnitLeftKer = False;
	        }
	        if (!Q->UnitLeftKer) {
	            Sum = 0.0;
	            for(Ind = 1; Ind <= Dim; Ind++) {
	                Cmp = KerCmp[Ind];
	                Sum += Cmp * Cmp;
	            }
		    Norm = sqrt(Sum);
		    if (!IsZero(Norm)) {
                        Q->LeftKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		        if (Q->LeftKerCmp != NULL) {
		            for(Ind = 1; Ind <= Dim; Ind++)
	                        Q->LeftKerCmp[Ind] = KerCmp[Ind] / Norm;
		        } else {
	                    LASError(LASMemAllocErr, "Q_SetKer", Q->Name,
				RightKer->Name, LeftKer->Name);
		        }
	    	    }
	        }
	    } else {
	    }
	} else {
	    LASError(LASDimErr, "Q_SetKer", Q->Name, RightKer->Name, LeftKer->Name);
	}
    }

    V_Unlock(RightKer);
    V_Unlock(LeftKer);
}